

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abc.c
# Opt level: O2

int Abc_CommandAbc9Gla2Vta(Abc_Frame_t *pAbc,int argc,char **argv)

{
  Gia_Man_t *pGVar1;
  bool bVar2;
  int iVar3;
  int iVar4;
  uint nFrames;
  Vec_Int_t *pVVar5;
  char *pcVar6;
  
  nFrames = pAbc->nFrames;
  bVar2 = false;
  Extra_UtilGetoptReset();
  while( true ) {
    while (iVar4 = Extra_UtilGetopt(argc,argv,"Fvh"), iVar3 = globalUtilOptind, iVar4 != 0x46) {
      if (iVar4 == -1) {
        pGVar1 = pAbc->pGia;
        if (pGVar1 == (Gia_Man_t *)0x0) {
          pcVar6 = "Abc_CommandAbc9Gla2Vta(): There is no AIG.\n";
        }
        else {
          if (pGVar1->vGateClasses != (Vec_Int_t *)0x0) {
            if (0 < pAbc->nFrames) {
              Vec_IntFreeP(&pGVar1->vObjClasses);
              pVVar5 = Gia_VtaConvertFromGla(pAbc->pGia,pAbc->pGia->vGateClasses,nFrames);
              pGVar1 = pAbc->pGia;
              pGVar1->vObjClasses = pVVar5;
              Vec_IntFreeP(&pGVar1->vGateClasses);
              return 0;
            }
            Abc_Print(-1,
                      "Abc_CommandAbc9Gla2Vta(): The number of timeframes (%d) should be a positive integer.\n"
                      ,(ulong)nFrames);
            return 0;
          }
          pcVar6 = "Abc_CommandAbc9Gla2Vta(): There is no gate-level abstraction is defined.\n";
        }
        Abc_Print(-1,pcVar6);
        return 0;
      }
      if (iVar4 != 0x76) goto LAB_00260049;
      bVar2 = (bool)(bVar2 ^ 1);
    }
    if (argc <= globalUtilOptind) break;
    nFrames = atoi(argv[globalUtilOptind]);
    globalUtilOptind = iVar3 + 1;
    if ((int)nFrames < 0) {
LAB_00260049:
      Abc_Print(-2,"usage: &gla_vta [-F num] [-vh]\n");
      Abc_Print(-2,"\t          maps fixed- into variable-time-frame gate-level abstraction\n");
      Abc_Print(-2,
                "\t-F num  : timeframes in the resulting variable-time-frame abstraction [default = %d]\n"
                ,(ulong)nFrames);
      pcVar6 = "yes";
      if (!bVar2) {
        pcVar6 = "no";
      }
      Abc_Print(-2,"\t-v      : toggle printing verbose information [default = %s]\n",pcVar6);
      Abc_Print(-2,"\t-h      : print the command usage\n");
      return 1;
    }
  }
  Abc_Print(-1,"Command line switch \"-F\" should be followed by an integer.\n");
  goto LAB_00260049;
}

Assistant:

int Abc_CommandAbc9Gla2Vta( Abc_Frame_t * pAbc, int argc, char ** argv )
{
    int c, fVerbose = 0;
    int nFrames = pAbc->nFrames;
    Extra_UtilGetoptReset();
    while ( ( c = Extra_UtilGetopt( argc, argv, "Fvh" ) ) != EOF )
    {
        switch ( c )
        {
        case 'F':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-F\" should be followed by an integer.\n" );
                goto usage;
            }
            nFrames = atoi(argv[globalUtilOptind]);
            globalUtilOptind++;
            if ( nFrames < 0 )
                goto usage;
            break;
        case 'v':
            fVerbose ^= 1;
            break;
        case 'h':
            goto usage;
        default:
            goto usage;
        }
    }
    if ( pAbc->pGia == NULL )
    {
        Abc_Print( -1, "Abc_CommandAbc9Gla2Vta(): There is no AIG.\n" );
        return 0;
    }
    if ( pAbc->pGia->vGateClasses == NULL )
    {
        Abc_Print( -1, "Abc_CommandAbc9Gla2Vta(): There is no gate-level abstraction is defined.\n" );
        return 0;
    }
    if ( pAbc->nFrames < 1 )
    {
        Abc_Print( -1, "Abc_CommandAbc9Gla2Vta(): The number of timeframes (%d) should be a positive integer.\n", nFrames );
        return 0;
    }
    Vec_IntFreeP( &pAbc->pGia->vObjClasses );
    pAbc->pGia->vObjClasses = Gia_VtaConvertFromGla( pAbc->pGia, pAbc->pGia->vGateClasses, nFrames );
    Vec_IntFreeP( &pAbc->pGia->vGateClasses );
    return 0;

usage:
    Abc_Print( -2, "usage: &gla_vta [-F num] [-vh]\n" );
    Abc_Print( -2, "\t          maps fixed- into variable-time-frame gate-level abstraction\n" );
    Abc_Print( -2, "\t-F num  : timeframes in the resulting variable-time-frame abstraction [default = %d]\n", nFrames );
    Abc_Print( -2, "\t-v      : toggle printing verbose information [default = %s]\n", fVerbose? "yes": "no" );
    Abc_Print( -2, "\t-h      : print the command usage\n");
    return 1;
}